

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImRect::Add(ImRect *this,ImVec2 *rhs)

{
  float *pfVar1;
  float fVar2;
  
  if (rhs->x < (this->Min).x) {
    (this->Min).x = rhs->x;
  }
  if (rhs->y < (this->Min).y) {
    (this->Min).y = rhs->y;
  }
  fVar2 = rhs->x;
  if ((this->Max).x <= fVar2 && fVar2 != (this->Max).x) {
    (this->Max).x = fVar2;
  }
  fVar2 = rhs->y;
  pfVar1 = &(this->Max).y;
  if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
    (this->Max).y = fVar2;
  }
  return;
}

Assistant:

void        Add(const ImVec2& rhs)          { if (Min.x > rhs.x)     Min.x = rhs.x;     if (Min.y > rhs.y) Min.y = rhs.y;         if (Max.x < rhs.x) Max.x = rhs.x;         if (Max.y < rhs.y) Max.y = rhs.y; }